

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  MessageLite *pMVar4;
  LogFinisher local_65;
  int value_local;
  LogMessage local_60;
  Extension *extension;
  
  value_local = value;
  bVar1 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar1) {
    extension->type = type;
    CVar2 = anon_unknown_0::cpp_type(type);
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x16b);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    extension->is_repeated = true;
    extension->is_packed = packed;
    pMVar4 = (MessageLite *)operator_new(0x10);
    pMVar4->_vptr_MessageLite = (_func_int **)0x0;
    pMVar4[1]._vptr_MessageLite = (_func_int **)0x0;
    (extension->field_0).message_value = pMVar4;
  }
  else {
    if (extension->is_repeated == false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x170);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    CVar2 = anon_unknown_0::cpp_type(extension->type);
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x170);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    if (extension->is_packed != packed) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x171);
      pLVar3 = LogMessage::operator<<
                         (&local_60,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
  }
  RepeatedField<int>::Add((extension->field_0).repeated_int32_value,&value_local);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type,
                           bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value = new RepeatedField<int>();
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}